

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O0

void aom_upsampled_pred_c
               (MACROBLOCKD *xd,AV1_COMMON *cm,int mi_row,int mi_col,MV *mv,uint8_t *comp_pred,
               int width,int height,int subpel_x_q3,int subpel_y_q3,uint8_t *ref,int ref_stride,
               int subpel_search)

{
  int_interpfilters block_height;
  scale_factors *psVar1;
  InterpFilterParams *filter_params;
  int16_t *piVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  MACROBLOCKD *in_RDI;
  void *in_R9;
  int_interpfilters in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  void *in_stack_00000028;
  int in_stack_00000030;
  int in_stack_00000038;
  int intermediate_height;
  int16_t *kernel_y;
  int16_t *kernel_x;
  uint8_t temp [36864];
  int16_t *kernel_1;
  int16_t *kernel;
  int i;
  InterpFilterParams *filter;
  int_interpfilters filters;
  InterPredParams inter_pred_params;
  buf_2d *pre_buf;
  buf_2d *dst_buf;
  macroblockd_plane *pd;
  int mi_y;
  int mi_x;
  int plane;
  int is_scaled;
  scale_factors *sf;
  int is_intrabc;
  int ref_num;
  MB_MODE_INFO *mi;
  undefined8 in_stack_ffffffffffff6dc8;
  undefined4 uVar3;
  InterPredParams *inter_pred_params_00;
  undefined4 in_stack_ffffffffffff6dd0;
  int iVar4;
  undefined4 in_stack_ffffffffffff6dd4;
  int in_stack_ffffffffffff6ddc;
  int in_stack_ffffffffffff6de0;
  int iVar5;
  int in_stack_ffffffffffff6de4;
  undefined8 in_stack_ffffffffffff6de8;
  int16_t *in_stack_ffffffffffff6df0;
  undefined4 in_stack_ffffffffffff6df8;
  int in_stack_ffffffffffff6dfc;
  uint8_t *in_stack_ffffffffffff6e00;
  InterPredParams *inter_pred_params_01;
  undefined4 in_stack_ffffffffffff6e08;
  undefined4 in_stack_ffffffffffff6e0c;
  undefined4 in_stack_ffffffffffff6e10;
  undefined4 in_stack_ffffffffffff6e14;
  int subsampling_y;
  int16_t *in_stack_ffffffffffff6e20;
  int in_stack_ffffffffffff6e28;
  int in_stack_ffffffffffff6e30;
  int in_stack_ffffffffffff6e38;
  scale_factors *in_stack_ffffffffffff6e40;
  buf_2d *in_stack_ffffffffffff6e48;
  int local_1a4;
  undefined1 local_190 [96];
  undefined1 auStack_130 [184];
  macroblockd_plane *local_78;
  int local_70;
  int local_6c;
  undefined4 local_68;
  int local_64;
  scale_factors *local_60;
  int local_58;
  undefined4 local_54;
  MB_MODE_INFO *local_50;
  void *local_48;
  int local_38;
  int local_34;
  long local_30;
  MACROBLOCKD *local_28;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffff6de8 >> 0x20);
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffff6dc8 >> 0x20);
  local_48 = in_R9;
  if (in_RDI != (MACROBLOCKD *)0x0) {
    local_50 = *in_RDI->mi;
    local_54 = 0;
    local_38 = in_ECX;
    local_34 = in_EDX;
    local_30 = in_RSI;
    local_28 = in_RDI;
    local_58 = is_intrabc_block(local_50);
    if (local_58 == 0) {
      psVar1 = local_28->block_ref_scale_factors[0];
    }
    else {
      psVar1 = (scale_factors *)(local_30 + 0x110);
    }
    local_60 = psVar1;
    local_64 = av1_is_scaled((scale_factors *)
                             CONCAT44(in_stack_ffffffffffff6dd4,in_stack_ffffffffffff6dd0));
    in_stack_ffffffffffff6e28 = (int)psVar1;
    if (local_64 != 0) {
      local_68._0_1_ = BLOCK_4X4;
      local_68._1_3_ = 0;
      local_6c = local_38 << 2;
      local_70 = local_34 << 2;
      local_78 = local_28->plane;
      auStack_130._176_8_ = &local_28->plane[0].dst;
      psVar1 = (scale_factors *)auStack_130._176_8_;
      if (local_58 == 0) {
        psVar1 = (scale_factors *)local_28->plane[0].pre;
      }
      inter_pred_params_01 = (InterPredParams *)auStack_130;
      auStack_130._168_8_ = psVar1;
      get_conv_params(in_stack_ffffffffffff6de4,in_stack_ffffffffffff6de0,in_stack_ffffffffffff6ddc)
      ;
      subsampling_y = (int)psVar1;
      memcpy(inter_pred_params_01,local_190,0x30);
      block_height = av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
      iVar5 = local_78->subsampling_y;
      iVar4 = local_28->bd;
      is_cur_buf_hbd(local_28);
      inter_pred_params_00 = (InterPredParams *)CONCAT44(uVar3,iVar5);
      iVar5 = local_58;
      av1_init_inter_params
                (inter_pred_params_01,in_stack_ffffffffffff6dfc,block_height.as_int,
                 SUB84(auStack_130._168_8_,4),(int)auStack_130._168_8_,
                 (int)((ulong)local_60 >> 0x20),subsampling_y,in_stack_ffffffffffff6e28,
                 in_stack_ffffffffffff6e30,in_stack_ffffffffffff6e38,in_stack_ffffffffffff6e40,
                 in_stack_ffffffffffff6e48,in_stack_00000008);
      av1_enc_build_one_inter_predictor
                ((uint8_t *)CONCAT44(in_stack_ffffffffffff6de4,iVar5),in_stack_ffffffffffff6ddc,
                 (MV *)CONCAT44(in_stack_ffffffffffff6dd4,iVar4),inter_pred_params_00);
      return;
    }
    local_64 = 0;
  }
  filter_params = av1_get_filter(in_stack_00000038);
  if ((in_stack_00000018 == 0) && (in_stack_00000020 == 0)) {
    for (local_1a4 = 0; local_1a4 < in_stack_00000010; local_1a4 = local_1a4 + 1) {
      memcpy(local_48,in_stack_00000028,(long)(int)in_stack_00000008.as_int);
      local_48 = (void *)((long)local_48 + (long)(int)in_stack_00000008.as_int);
      in_stack_00000028 = (void *)((long)in_stack_00000028 + (long)in_stack_00000030);
    }
  }
  else if (in_stack_00000020 == 0) {
    av1_get_interp_filter_subpel_kernel(filter_params,in_stack_00000018 << 1);
    aom_convolve8_horiz_c
              ((uint8_t *)CONCAT44(in_stack_ffffffffffff6e14,in_stack_ffffffffffff6e10),
               CONCAT44(in_stack_ffffffffffff6e0c,in_stack_ffffffffffff6e08),
               in_stack_ffffffffffff6e00,
               CONCAT44(in_stack_ffffffffffff6dfc,in_stack_ffffffffffff6df8),
               in_stack_ffffffffffff6df0,iVar5,in_stack_ffffffffffff6e20,in_stack_ffffffffffff6e28,
               in_stack_ffffffffffff6e30,in_stack_ffffffffffff6e38);
  }
  else if (in_stack_00000018 == 0) {
    av1_get_interp_filter_subpel_kernel(filter_params,in_stack_00000020 << 1);
    aom_convolve8_vert_c
              ((uint8_t *)CONCAT44(in_stack_ffffffffffff6e14,in_stack_ffffffffffff6e10),
               CONCAT44(in_stack_ffffffffffff6e0c,in_stack_ffffffffffff6e08),
               in_stack_ffffffffffff6e00,
               CONCAT44(in_stack_ffffffffffff6dfc,in_stack_ffffffffffff6df8),
               in_stack_ffffffffffff6df0,iVar5,in_stack_ffffffffffff6e20,in_stack_ffffffffffff6e28,
               in_stack_ffffffffffff6e30,in_stack_ffffffffffff6e38);
  }
  else {
    av1_get_interp_filter_subpel_kernel(filter_params,in_stack_00000018 << 1);
    piVar2 = av1_get_interp_filter_subpel_kernel(filter_params,in_stack_00000020 << 1);
    iVar4 = (int)piVar2;
    aom_convolve8_horiz_c
              ((uint8_t *)CONCAT44(in_stack_ffffffffffff6e14,in_stack_ffffffffffff6e10),
               CONCAT44(in_stack_ffffffffffff6e0c,in_stack_ffffffffffff6e08),
               in_stack_ffffffffffff6e00,
               CONCAT44(in_stack_ffffffffffff6dfc,in_stack_ffffffffffff6df8),
               in_stack_ffffffffffff6df0,iVar5,in_stack_ffffffffffff6e20,in_stack_ffffffffffff6e28,
               in_stack_ffffffffffff6e30,iVar4);
    aom_convolve8_vert_c
              ((uint8_t *)CONCAT44(in_stack_ffffffffffff6e14,in_stack_ffffffffffff6e10),
               CONCAT44(in_stack_ffffffffffff6e0c,in_stack_ffffffffffff6e08),
               in_stack_ffffffffffff6e00,
               CONCAT44(in_stack_ffffffffffff6dfc,in_stack_ffffffffffff6df8),
               in_stack_ffffffffffff6df0,iVar5,in_stack_ffffffffffff6e20,in_stack_ffffffffffff6e28,
               in_stack_ffffffffffff6e30,iVar4);
  }
  return;
}

Assistant:

void aom_upsampled_pred_c(MACROBLOCKD *xd, const AV1_COMMON *const cm,
                          int mi_row, int mi_col, const MV *const mv,
                          uint8_t *comp_pred, int width, int height,
                          int subpel_x_q3, int subpel_y_q3, const uint8_t *ref,
                          int ref_stride, int subpel_search) {
  // expect xd == NULL only in tests
  if (xd != NULL) {
    const MB_MODE_INFO *mi = xd->mi[0];
    const int ref_num = 0;
    const int is_intrabc = is_intrabc_block(mi);
    const struct scale_factors *const sf =
        is_intrabc ? &cm->sf_identity : xd->block_ref_scale_factors[ref_num];
    const int is_scaled = av1_is_scaled(sf);

    if (is_scaled) {
      int plane = 0;
      const int mi_x = mi_col * MI_SIZE;
      const int mi_y = mi_row * MI_SIZE;
      const struct macroblockd_plane *const pd = &xd->plane[plane];
      const struct buf_2d *const dst_buf = &pd->dst;
      const struct buf_2d *const pre_buf =
          is_intrabc ? dst_buf : &pd->pre[ref_num];

      InterPredParams inter_pred_params;
      inter_pred_params.conv_params = get_conv_params(0, plane, xd->bd);
      const int_interpfilters filters =
          av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
      av1_init_inter_params(
          &inter_pred_params, width, height, mi_y >> pd->subsampling_y,
          mi_x >> pd->subsampling_x, pd->subsampling_x, pd->subsampling_y,
          xd->bd, is_cur_buf_hbd(xd), is_intrabc, sf, pre_buf, filters);
      av1_enc_build_one_inter_predictor(comp_pred, width, mv,
                                        &inter_pred_params);
      return;
    }
  }

  const InterpFilterParams *filter = av1_get_filter(subpel_search);

  if (!subpel_x_q3 && !subpel_y_q3) {
    for (int i = 0; i < height; i++) {
      memcpy(comp_pred, ref, width * sizeof(*comp_pred));
      comp_pred += width;
      ref += ref_stride;
    }
  } else if (!subpel_y_q3) {
    const int16_t *const kernel =
        av1_get_interp_filter_subpel_kernel(filter, subpel_x_q3 << 1);
    aom_convolve8_horiz_c(ref, ref_stride, comp_pred, width, kernel, 16, NULL,
                          -1, width, height);
  } else if (!subpel_x_q3) {
    const int16_t *const kernel =
        av1_get_interp_filter_subpel_kernel(filter, subpel_y_q3 << 1);
    aom_convolve8_vert_c(ref, ref_stride, comp_pred, width, NULL, -1, kernel,
                         16, width, height);
  } else {
    DECLARE_ALIGNED(16, uint8_t,
                    temp[((MAX_SB_SIZE * 2 + 16) + 16) * MAX_SB_SIZE]);
    const int16_t *const kernel_x =
        av1_get_interp_filter_subpel_kernel(filter, subpel_x_q3 << 1);
    const int16_t *const kernel_y =
        av1_get_interp_filter_subpel_kernel(filter, subpel_y_q3 << 1);
    const int intermediate_height =
        (((height - 1) * 8 + subpel_y_q3) >> 3) + filter->taps;
    assert(intermediate_height <= (MAX_SB_SIZE * 2 + 16) + 16);
    aom_convolve8_horiz_c(ref - ref_stride * ((filter->taps >> 1) - 1),
                          ref_stride, temp, MAX_SB_SIZE, kernel_x, 16, NULL, -1,
                          width, intermediate_height);
    aom_convolve8_vert_c(temp + MAX_SB_SIZE * ((filter->taps >> 1) - 1),
                         MAX_SB_SIZE, comp_pred, width, NULL, -1, kernel_y, 16,
                         width, height);
  }
}